

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

void nng_socket_recv(nng_socket s,nng_aio *aio)

{
  nng_err result;
  nni_sock *pnStack_20;
  int rv;
  nni_sock *sock;
  nng_aio *aio_local;
  nng_socket s_local;
  
  sock = (nni_sock *)aio;
  aio_local._4_4_ = s.id;
  nni_aio_reset(aio);
  result = nni_sock_find(&stack0xffffffffffffffe0,aio_local._4_4_);
  if (result == NNG_OK) {
    nni_sock_recv(pnStack_20,(nni_aio *)sock);
    nni_sock_rele(pnStack_20);
  }
  else {
    nni_aio_finish_error((nni_aio *)sock,result);
  }
  return;
}

Assistant:

void
nng_socket_recv(nng_socket s, nng_aio *aio)
{
	nni_sock *sock;
	int       rv;

	nni_aio_reset(aio);
	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_sock_recv(sock, aio);
	nni_sock_rele(sock);
}